

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O0

bool __thiscall soplex::SPxSolverBase<double>::performSolutionPolishing(SPxSolverBase<double> *this)

{
  SPxRatioTester<double> *pSVar1;
  Status *pSVar2;
  bool bVar3;
  int iVar4;
  Status SVar5;
  Verbosity VVar6;
  Representation RVar7;
  Type TVar8;
  int iVar9;
  int *piVar10;
  char *pcVar11;
  DataKey *pDVar12;
  SPxId *args_1;
  double *pdVar13;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  int __c_03;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar14;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  SPxSolverBase<double> *in_RDI;
  SPxSolverBase<double> *unaff_retaddr;
  Verbosity old_verbosity_1;
  int i_9;
  int i_8;
  DIdxSet basiccandidates_1;
  int i_7;
  int i_6;
  DIdxSet basiccandidates;
  int ncols_1;
  bool useIntegrality;
  int i_5;
  int i_4;
  DIdxSet candidates;
  int i_3;
  int i_2;
  int i_1;
  int i;
  DIdxSet continuousvars;
  DIdxSet slackcandidates;
  int ncols;
  int nrows;
  Verbosity old_verbosity;
  double origval;
  double alloweddeviation;
  bool success;
  SPxId polishId;
  Status stat;
  Status *colstatus;
  Status *rowstatus;
  Desc *ds;
  int nSuccessfulPivots;
  bool stop;
  undefined4 in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffcec;
  undefined6 in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf6;
  undefined1 in_stack_fffffffffffffcf7;
  SPxSolverBase<double> *in_stack_fffffffffffffcf8;
  SPxStatus stat_00;
  SPxSolverBase<double> *in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd08;
  undefined2 in_stack_fffffffffffffd0c;
  undefined1 in_stack_fffffffffffffd0e;
  byte bVar15;
  undefined1 in_stack_fffffffffffffd0f;
  DIdxSet *in_stack_fffffffffffffd10;
  SPxSolverBase<double> *in_stack_fffffffffffffd18;
  byte local_29a;
  byte local_21a;
  byte local_1fd;
  byte local_1db;
  byte local_1c2;
  byte local_179;
  undefined4 local_178;
  Verbosity local_174;
  uint local_170;
  SPxColId local_16c;
  int local_164;
  IdxSet local_160;
  uint local_140;
  SPxColId local_13c;
  int local_134;
  IdxSet local_130;
  int local_110;
  byte local_109;
  DataKey local_108;
  uint local_100;
  int local_fc;
  IdxSet local_f8;
  DataKey local_d4;
  uint local_cc;
  DataKey local_c8;
  uint local_c0;
  int local_bc;
  int local_b8;
  IdxSet local_a8;
  IdxSet local_88;
  int local_68;
  int local_64;
  undefined4 local_60;
  Verbosity local_5c [3];
  double local_50;
  byte local_41;
  DataKey local_40;
  Status local_34;
  Status *local_30;
  Status *local_28;
  Desc *local_20;
  int local_18;
  byte local_11;
  SPxSolverBase<double> *pSVar16;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  local_179 = 0;
  pSVar16 = in_RDI;
  if (-1 < in_RDI->maxIters) {
    iVar4 = iterations((SPxSolverBase<double> *)0x240ade);
    local_179 = 0;
    if (in_RDI->maxIters <= iVar4) {
      bVar3 = isTimeLimitReached(in_stack_fffffffffffffd18,
                                 SUB81((ulong)in_stack_fffffffffffffd10 >> 0x38,0));
      local_179 = bVar3 ^ 0xff;
    }
  }
  local_11 = local_179 & 1;
  if (((local_11 == 0) && (in_RDI->polishObj != POLISH_OFF)) &&
     (SVar5 = status(in_stack_fffffffffffffcf8), SVar5 == OPTIMAL)) {
    local_20 = SPxBasisBase<double>::desc(&in_RDI->super_SPxBasisBase<double>);
    local_28 = SPxBasisBase<double>::Desc::rowStatus((Desc *)0x240b84);
    local_30 = SPxBasisBase<double>::Desc::colStatus((Desc *)0x240b99);
    SPxId::SPxId((SPxId *)0x240bae);
    local_41 = 0;
    (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x5e])();
    if ((in_RDI->spxout != (SPxOut *)0x0) &&
       (VVar6 = SPxOut::getVerbosity(in_RDI->spxout), 3 < (int)VVar6)) {
      local_5c[0] = SPxOut::getVerbosity(in_RDI->spxout);
      local_60 = 4;
      (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_60);
      soplex::operator<<((SPxOut *)
                         CONCAT17(in_stack_fffffffffffffcf7,
                                  CONCAT16(in_stack_fffffffffffffcf6,in_stack_fffffffffffffcf0)),
                         (char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      soplex::operator<<((SPxOut *)
                         CONCAT17(in_stack_fffffffffffffcf7,
                                  CONCAT16(in_stack_fffffffffffffcf6,in_stack_fffffffffffffcf0)),
                         (_func_ostream_ptr_ostream_ptr *)
                         CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,local_5c);
    }
    RVar7 = rep(in_RDI);
    TVar8 = (Type)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
    if (RVar7 == COLUMN) {
      setType(in_stack_fffffffffffffd00,TVar8);
      (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x76])();
      local_50 = entertol((SPxSolverBase<double> *)
                          CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      in_RDI->instableEnter = false;
      pSVar1 = in_RDI->theratiotester;
      TVar8 = type(in_RDI);
      (*pSVar1->_vptr_SPxRatioTester[9])(pSVar1,(ulong)(uint)TVar8);
      local_64 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x240d26);
      local_68 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x240d3a);
      if (in_RDI->polishObj == POLISH_INTEGRALITY) {
        DIdxSet::DIdxSet(in_stack_fffffffffffffd10,
                         CONCAT13(in_stack_fffffffffffffd0f,
                                  CONCAT12(in_stack_fffffffffffffd0e,in_stack_fffffffffffffd0c)));
        DIdxSet::DIdxSet(in_stack_fffffffffffffd10,
                         CONCAT13(in_stack_fffffffffffffd0f,
                                  CONCAT12(in_stack_fffffffffffffd0e,in_stack_fffffffffffffd0c)));
        for (local_b8 = 0; local_b8 < local_64; local_b8 = local_b8 + 1) {
          if ((local_28[local_b8] == P_ON_LOWER) || (local_28[local_b8] == P_ON_UPPER)) {
            VectorBase<double>::operator[]
                      ((VectorBase<double> *)
                       CONCAT17(in_stack_fffffffffffffcf7,
                                CONCAT16(in_stack_fffffffffffffcf6,in_stack_fffffffffffffcf0)),
                       in_stack_fffffffffffffcec);
            epsilon((SPxSolverBase<double> *)0x240e06);
            bVar3 = EQrel<double,double,double>
                              ((double)CONCAT17(in_stack_fffffffffffffcf7,
                                                CONCAT16(in_stack_fffffffffffffcf6,
                                                         in_stack_fffffffffffffcf0)),
                               (double)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8)
                               ,1.16743907806814e-317);
            if (bVar3) {
              DIdxSet::addIdx((DIdxSet *)
                              CONCAT17(in_stack_fffffffffffffcf7,
                                       CONCAT16(in_stack_fffffffffffffcf6,in_stack_fffffffffffffcf0)
                                      ),in_stack_fffffffffffffcec);
            }
          }
        }
        iVar4 = DataArray<int>::size(&in_RDI->integerVariables);
        if (iVar4 == local_68) {
          for (local_bc = 0; local_bc < local_68; local_bc = local_bc + 1) {
            if ((local_30[local_bc] == P_ON_LOWER) || (local_30[local_bc] == P_ON_UPPER)) {
              SPxLPBase<double>::maxObj
                        ((SPxLPBase<double> *)
                         CONCAT17(in_stack_fffffffffffffcf7,
                                  CONCAT16(in_stack_fffffffffffffcf6,in_stack_fffffffffffffcf0)),
                         in_stack_fffffffffffffcec);
              VectorBase<double>::operator[]
                        ((VectorBase<double> *)
                         CONCAT17(in_stack_fffffffffffffcf7,
                                  CONCAT16(in_stack_fffffffffffffcf6,in_stack_fffffffffffffcf0)),
                         in_stack_fffffffffffffcec);
              epsilon((SPxSolverBase<double> *)0x240f88);
              bVar3 = EQrel<double,double,double>
                                ((double)CONCAT17(in_stack_fffffffffffffcf7,
                                                  CONCAT16(in_stack_fffffffffffffcf6,
                                                           in_stack_fffffffffffffcf0)),
                                 (double)CONCAT44(in_stack_fffffffffffffcec,
                                                  in_stack_fffffffffffffce8),1.16762978740743e-317);
              if ((bVar3) &&
                 (piVar10 = DataArray<int>::operator[](&in_RDI->integerVariables,local_bc),
                 *piVar10 == 0)) {
                DIdxSet::addIdx((DIdxSet *)
                                CONCAT17(in_stack_fffffffffffffcf7,
                                         CONCAT16(in_stack_fffffffffffffcf6,
                                                  in_stack_fffffffffffffcf0)),
                                in_stack_fffffffffffffcec);
              }
            }
          }
        }
        while (stat_00 = (SPxStatus)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
              ((local_11 ^ 0xff) & 1) != 0) {
          local_18 = 0;
          local_c0 = IdxSet::size(&local_88);
          uVar14 = extraout_RDX;
          while( true ) {
            local_c0 = local_c0 - 1;
            local_1c2 = 0;
            if (-1 < (int)local_c0) {
              local_1c2 = local_11 ^ 0xff;
            }
            if ((local_1c2 & 1) == 0) break;
            IdxSet::index(&local_88,(char *)(ulong)local_c0,(int)uVar14);
            local_c8 = (DataKey)coId((SPxSolverBase<double> *)
                                     CONCAT17(in_stack_fffffffffffffd0f,
                                              CONCAT16(in_stack_fffffffffffffd0e,
                                                       CONCAT24(in_stack_fffffffffffffd0c,
                                                                in_stack_fffffffffffffd08))),
                                     (int)((ulong)in_stack_fffffffffffffd00 >> 0x20));
            pSVar2 = local_28;
            local_40 = local_c8;
            pcVar11 = IdxSet::index(&local_88,(char *)(ulong)local_c0,__c);
            SPxOut::
            debug<soplex::SPxSolverBase<double>,_const_char_(&)[27],_soplex::SPxId_&,_const_soplex::SPxBasisBase<double>::Desc::Status_&,_0>
                      (in_RDI,(char (*) [27])"try pivoting: {} stat: {}\n",(SPxId *)&local_40,
                       pSVar2 + (int)pcVar11);
            local_41 = enter(unaff_retaddr,
                             (SPxId *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                             SUB81((ulong)pSVar16 >> 0x38,0));
            (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
              super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x88])();
            if ((local_41 & 1) != 0) {
              SPxOut::debug<soplex::SPxSolverBase<double>,_const_char_(&)[13],_0>
                        (in_RDI,(char (*) [13])" -> success!");
              local_18 = local_18 + 1;
              IdxSet::remove(&local_88,(char *)(ulong)local_c0);
              if ((-1 < in_RDI->maxIters) &&
                 (iVar4 = iterations((SPxSolverBase<double> *)0x2411cc), in_RDI->maxIters <= iVar4))
              {
                local_11 = 1;
              }
            }
            SPxOut::debug<soplex::SPxSolverBase<double>,_const_char_(&)[2],_0>
                      (in_RDI,(char (*) [2])0x7e7535);
            bVar3 = isTimeLimitReached(in_stack_fffffffffffffd18,
                                       SUB81((ulong)in_stack_fffffffffffffd10 >> 0x38,0));
            uVar14 = extraout_RDX_00;
            if (bVar3) {
              local_11 = 1;
            }
          }
          local_cc = IdxSet::size(&local_a8);
          uVar14 = extraout_RDX_01;
          while( true ) {
            local_cc = local_cc - 1;
            local_1db = 0;
            if (-1 < (int)local_cc) {
              local_1db = local_11 ^ 0xff;
            }
            if ((local_1db & 1) == 0) break;
            IdxSet::index(&local_a8,(char *)(ulong)local_cc,(int)uVar14);
            local_d4 = (DataKey)id((SPxSolverBase<double> *)
                                   CONCAT17(in_stack_fffffffffffffd0f,
                                            CONCAT16(in_stack_fffffffffffffd0e,
                                                     CONCAT24(in_stack_fffffffffffffd0c,
                                                              in_stack_fffffffffffffd08))),
                                   (int)((ulong)in_stack_fffffffffffffd00 >> 0x20));
            pSVar2 = local_30;
            local_40 = local_d4;
            pcVar11 = IdxSet::index(&local_a8,(char *)(ulong)local_cc,__c_00);
            SPxOut::
            debug<soplex::SPxSolverBase<double>,_const_char_(&)[27],_soplex::SPxId_&,_const_soplex::SPxBasisBase<double>::Desc::Status_&,_0>
                      (in_RDI,(char (*) [27])"try pivoting: {} stat: {}\n",(SPxId *)&local_40,
                       pSVar2 + (int)pcVar11);
            local_41 = enter(unaff_retaddr,
                             (SPxId *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                             SUB81((ulong)pSVar16 >> 0x38,0));
            (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
              super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x88])();
            if ((local_41 & 1) != 0) {
              SPxOut::debug<soplex::SPxSolverBase<double>,_const_char_(&)[13],_0>
                        (in_RDI,(char (*) [13])" -> success!");
              local_18 = local_18 + 1;
              IdxSet::remove(&local_a8,(char *)(ulong)local_cc);
              if ((-1 < in_RDI->maxIters) &&
                 (iVar4 = iterations((SPxSolverBase<double> *)0x2413d7), in_RDI->maxIters <= iVar4))
              {
                local_11 = 1;
              }
            }
            SPxOut::debug<soplex::SPxSolverBase<double>,_const_char_(&)[2],_0>
                      (in_RDI,(char (*) [2])0x7e7535);
            bVar3 = isTimeLimitReached(in_stack_fffffffffffffd18,
                                       SUB81((ulong)in_stack_fffffffffffffd10 >> 0x38,0));
            uVar14 = extraout_RDX_02;
            if (bVar3) {
              local_11 = 1;
            }
          }
          if (local_18 == 0) {
            local_11 = 1;
          }
          in_RDI->polishCount = local_18 + in_RDI->polishCount;
        }
        DIdxSet::~DIdxSet((DIdxSet *)
                          CONCAT17(in_stack_fffffffffffffcf7,
                                   CONCAT16(in_stack_fffffffffffffcf6,in_stack_fffffffffffffcf0)));
        DIdxSet::~DIdxSet((DIdxSet *)
                          CONCAT17(in_stack_fffffffffffffcf7,
                                   CONCAT16(in_stack_fffffffffffffcf6,in_stack_fffffffffffffcf0)));
      }
      else {
        dim((SPxSolverBase<double> *)0x2414bc);
        DIdxSet::DIdxSet(in_stack_fffffffffffffd10,
                         CONCAT13(in_stack_fffffffffffffd0f,
                                  CONCAT12(in_stack_fffffffffffffd0e,in_stack_fffffffffffffd0c)));
        local_fc = 0;
        while( true ) {
          iVar4 = local_fc;
          iVar9 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2414f1);
          local_1fd = 0;
          if (iVar4 < iVar9) {
            local_1fd = local_11 ^ 0xff;
          }
          if ((local_1fd & 1) == 0) break;
          if ((local_30[local_fc] == P_ON_LOWER) || (local_30[local_fc] == P_ON_UPPER)) {
            SPxLPBase<double>::maxObj
                      ((SPxLPBase<double> *)
                       CONCAT17(in_stack_fffffffffffffcf7,
                                CONCAT16(in_stack_fffffffffffffcf6,in_stack_fffffffffffffcf0)),
                       in_stack_fffffffffffffcec);
            VectorBase<double>::operator[]
                      ((VectorBase<double> *)
                       CONCAT17(in_stack_fffffffffffffcf7,
                                CONCAT16(in_stack_fffffffffffffcf6,in_stack_fffffffffffffcf0)),
                       in_stack_fffffffffffffcec);
            epsilon((SPxSolverBase<double> *)0x2415cb);
            bVar3 = EQrel<double,double,double>
                              ((double)CONCAT17(in_stack_fffffffffffffcf7,
                                                CONCAT16(in_stack_fffffffffffffcf6,
                                                         in_stack_fffffffffffffcf0)),
                               (double)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8)
                               ,1.16842177463771e-317);
            if (bVar3) {
              DIdxSet::addIdx((DIdxSet *)
                              CONCAT17(in_stack_fffffffffffffcf7,
                                       CONCAT16(in_stack_fffffffffffffcf6,in_stack_fffffffffffffcf0)
                                      ),in_stack_fffffffffffffcec);
            }
          }
          local_fc = local_fc + 1;
        }
        while (stat_00 = (SPxStatus)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
              ((local_11 ^ 0xff) & 1) != 0) {
          local_18 = 0;
          local_100 = IdxSet::size(&local_f8);
          uVar14 = extraout_RDX_03;
          while( true ) {
            local_100 = local_100 - 1;
            local_21a = 0;
            if (-1 < (int)local_100) {
              local_21a = local_11 ^ 0xff;
            }
            if ((local_21a & 1) == 0) break;
            IdxSet::index(&local_f8,(char *)(ulong)local_100,(int)uVar14);
            local_108 = (DataKey)id((SPxSolverBase<double> *)
                                    CONCAT17(in_stack_fffffffffffffd0f,
                                             CONCAT16(in_stack_fffffffffffffd0e,
                                                      CONCAT24(in_stack_fffffffffffffd0c,
                                                               in_stack_fffffffffffffd08))),
                                    (int)((ulong)in_stack_fffffffffffffd00 >> 0x20));
            pSVar2 = local_30;
            local_40 = local_108;
            pcVar11 = IdxSet::index(&local_f8,(char *)(ulong)local_100,__c_01);
            SPxOut::
            debug<soplex::SPxSolverBase<double>,_const_char_(&)[27],_soplex::SPxId_&,_const_soplex::SPxBasisBase<double>::Desc::Status_&,_0>
                      (in_RDI,(char (*) [27])"try pivoting: {} stat: {}\n",(SPxId *)&local_40,
                       pSVar2 + (int)pcVar11);
            local_41 = enter(unaff_retaddr,
                             (SPxId *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                             SUB81((ulong)pSVar16 >> 0x38,0));
            (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
              super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x88])();
            if ((local_41 & 1) != 0) {
              SPxOut::debug<soplex::SPxSolverBase<double>,_const_char_(&)[13],_0>
                        (in_RDI,(char (*) [13])" -> success!");
              local_18 = local_18 + 1;
              IdxSet::remove(&local_f8,(char *)(ulong)local_100);
              if ((-1 < in_RDI->maxIters) &&
                 (iVar4 = iterations((SPxSolverBase<double> *)0x241813), in_RDI->maxIters <= iVar4))
              {
                local_11 = 1;
              }
            }
            SPxOut::debug<soplex::SPxSolverBase<double>,_const_char_(&)[2],_0>
                      (in_RDI,(char (*) [2])0x7e7535);
            bVar3 = isTimeLimitReached(in_stack_fffffffffffffd18,
                                       SUB81((ulong)in_stack_fffffffffffffd10 >> 0x38,0));
            uVar14 = extraout_RDX_04;
            if (bVar3) {
              local_11 = 1;
            }
          }
          if (local_18 == 0) {
            local_11 = 1;
          }
          in_RDI->polishCount = local_18 + in_RDI->polishCount;
        }
        DIdxSet::~DIdxSet((DIdxSet *)
                          CONCAT17(in_stack_fffffffffffffcf7,
                                   CONCAT16(in_stack_fffffffffffffcf6,in_stack_fffffffffffffcf0)));
      }
    }
    else {
      setType(in_stack_fffffffffffffd00,TVar8);
      (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x76])();
      local_50 = leavetol((SPxSolverBase<double> *)
                          CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      in_RDI->instableLeave = false;
      pSVar1 = in_RDI->theratiotester;
      TVar8 = type(in_RDI);
      (*pSVar1->_vptr_SPxRatioTester[9])(pSVar1,(ulong)(uint)TVar8);
      local_109 = 0;
      local_110 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x24194d);
      iVar4 = DataArray<int>::size(&in_RDI->integerVariables);
      if (iVar4 == local_110) {
        local_109 = 1;
      }
      if (in_RDI->polishObj == POLISH_INTEGRALITY) {
        dim((SPxSolverBase<double> *)0x24199b);
        DIdxSet::DIdxSet(in_stack_fffffffffffffd10,
                         CONCAT13(in_stack_fffffffffffffd0f,
                                  CONCAT12(in_stack_fffffffffffffd0e,in_stack_fffffffffffffd0c)));
        for (local_134 = 0; iVar4 = local_134, iVar9 = dim((SPxSolverBase<double> *)0x2419d0),
            iVar4 < iVar9; local_134 = local_134 + 1) {
          pDVar12 = &SPxBasisBase<double>::baseId
                               ((SPxBasisBase<double> *)
                                CONCAT17(in_stack_fffffffffffffcf7,
                                         CONCAT16(in_stack_fffffffffffffcf6,
                                                  in_stack_fffffffffffffcf0)),
                                in_stack_fffffffffffffcec)->super_DataKey;
          local_40 = *pDVar12;
          bVar3 = SPxId::isSPxRowId((SPxId *)&local_40);
          if (bVar3) {
            SPxLPBase<double>::number
                      (&in_stack_fffffffffffffd00->super_SPxLPBase<double>,
                       (SPxId *)in_stack_fffffffffffffcf8);
            local_34 = SPxBasisBase<double>::Desc::rowStatus
                                 ((Desc *)CONCAT17(in_stack_fffffffffffffcf7,
                                                   CONCAT16(in_stack_fffffffffffffcf6,
                                                            in_stack_fffffffffffffcf0)),
                                  in_stack_fffffffffffffcec);
LAB_00241b98:
            if ((local_34 == P_ON_LOWER) || (local_34 == P_ON_UPPER)) {
              VectorBase<double>::operator[]
                        ((VectorBase<double> *)
                         CONCAT17(in_stack_fffffffffffffcf7,
                                  CONCAT16(in_stack_fffffffffffffcf6,in_stack_fffffffffffffcf0)),
                         in_stack_fffffffffffffcec);
              epsilon((SPxSolverBase<double> *)0x241be5);
              bVar3 = EQrel<double,double,double>
                                ((double)CONCAT17(in_stack_fffffffffffffcf7,
                                                  CONCAT16(in_stack_fffffffffffffcf6,
                                                           in_stack_fffffffffffffcf0)),
                                 (double)CONCAT44(in_stack_fffffffffffffcec,
                                                  in_stack_fffffffffffffce8),1.16919350517652e-317);
              if (bVar3) {
                DIdxSet::addIdx((DIdxSet *)
                                CONCAT17(in_stack_fffffffffffffcf7,
                                         CONCAT16(in_stack_fffffffffffffcf6,
                                                  in_stack_fffffffffffffcf0)),
                                in_stack_fffffffffffffcec);
              }
            }
          }
          else {
            bVar3 = true;
            if ((local_109 & 1) != 0) {
              SPxColId::SPxColId(&local_13c,(SPxId *)&local_40);
              iVar4 = SPxLPBase<double>::number
                                ((SPxLPBase<double> *)
                                 CONCAT17(in_stack_fffffffffffffcf7,
                                          CONCAT16(in_stack_fffffffffffffcf6,
                                                   in_stack_fffffffffffffcf0)),
                                 (SPxColId *)
                                 CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
              piVar10 = DataArray<int>::operator[](&in_RDI->integerVariables,iVar4);
              bVar3 = *piVar10 == 1;
            }
            if (!bVar3) {
              SPxLPBase<double>::number
                        (&in_stack_fffffffffffffd00->super_SPxLPBase<double>,
                         (SPxId *)in_stack_fffffffffffffcf8);
              local_34 = SPxBasisBase<double>::Desc::colStatus
                                   ((Desc *)CONCAT17(in_stack_fffffffffffffcf7,
                                                     CONCAT16(in_stack_fffffffffffffcf6,
                                                              in_stack_fffffffffffffcf0)),
                                    in_stack_fffffffffffffcec);
              goto LAB_00241b98;
            }
          }
        }
        while (stat_00 = (SPxStatus)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
              ((local_11 ^ 0xff) & 1) != 0) {
          local_18 = 0;
          local_140 = IdxSet::size(&local_130);
          uVar14 = extraout_RDX_05;
          while( true ) {
            local_140 = local_140 - 1;
            local_29a = 0;
            if (-1 < (int)local_140) {
              local_29a = local_11 ^ 0xff;
            }
            if ((local_29a & 1) == 0) break;
            IdxSet::index(&local_130,(char *)(ulong)local_140,(int)uVar14);
            args_1 = SPxBasisBase<double>::baseId
                               ((SPxBasisBase<double> *)
                                CONCAT17(in_stack_fffffffffffffcf7,
                                         CONCAT16(in_stack_fffffffffffffcf6,
                                                  in_stack_fffffffffffffcf0)),
                                in_stack_fffffffffffffcec);
            SPxOut::debug<soplex::SPxSolverBase<double>,_const_char_(&)[17],_soplex::SPxId_&,_0>
                      (in_RDI,(char (*) [17])"try pivoting: {}",args_1);
            IdxSet::index(&local_130,(char *)(ulong)local_140,__c_02);
            local_41 = leave((SPxSolverBase<double> *)
                             CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                             (int)((ulong)pSVar16 >> 0x20),SUB81((ulong)pSVar16 >> 0x18,0));
            (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
              super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x88])();
            if ((local_41 & 1) != 0) {
              SPxOut::debug<soplex::SPxSolverBase<double>,_const_char_(&)[13],_0>
                        (in_RDI,(char (*) [13])" -> success!");
              local_18 = local_18 + 1;
              IdxSet::remove(&local_130,(char *)(ulong)local_140);
              if ((-1 < in_RDI->maxIters) &&
                 (iVar4 = iterations((SPxSolverBase<double> *)0x241db5), in_RDI->maxIters <= iVar4))
              {
                local_11 = 1;
              }
            }
            SPxOut::debug<soplex::SPxSolverBase<double>,_const_char_(&)[2],_0>
                      (in_RDI,(char (*) [2])0x7e7535);
            bVar3 = isTimeLimitReached(in_stack_fffffffffffffd18,
                                       SUB81((ulong)in_stack_fffffffffffffd10 >> 0x38,0));
            uVar14 = extraout_RDX_06;
            if (bVar3) {
              local_11 = 1;
            }
          }
          if (local_18 == 0) {
            local_11 = 1;
          }
          in_RDI->polishCount = local_18 + in_RDI->polishCount;
        }
        DIdxSet::~DIdxSet((DIdxSet *)
                          CONCAT17(in_stack_fffffffffffffcf7,
                                   CONCAT16(in_stack_fffffffffffffcf6,in_stack_fffffffffffffcf0)));
      }
      else {
        dim((SPxSolverBase<double> *)0x241e75);
        DIdxSet::DIdxSet(in_stack_fffffffffffffd10,
                         CONCAT13(in_stack_fffffffffffffd0f,
                                  CONCAT12(in_stack_fffffffffffffd0e,in_stack_fffffffffffffd0c)));
        for (local_164 = 0; iVar4 = local_164, iVar9 = dim((SPxSolverBase<double> *)0x241ea7),
            iVar4 < iVar9; local_164 = local_164 + 1) {
          pDVar12 = &SPxBasisBase<double>::baseId
                               ((SPxBasisBase<double> *)
                                CONCAT17(in_stack_fffffffffffffcf7,
                                         CONCAT16(in_stack_fffffffffffffcf6,
                                                  in_stack_fffffffffffffcf0)),
                                in_stack_fffffffffffffcec)->super_DataKey;
          local_40 = *pDVar12;
          bVar3 = SPxId::isSPxRowId((SPxId *)&local_40);
          if (!bVar3) {
            bVar3 = false;
            if ((local_109 & 1) != 0) {
              SPxColId::SPxColId(&local_16c,(SPxId *)&local_40);
              iVar4 = SPxLPBase<double>::number
                                ((SPxLPBase<double> *)
                                 CONCAT17(in_stack_fffffffffffffcf7,
                                          CONCAT16(in_stack_fffffffffffffcf6,
                                                   in_stack_fffffffffffffcf0)),
                                 (SPxColId *)
                                 CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
              piVar10 = DataArray<int>::operator[](&in_RDI->integerVariables,iVar4);
              bVar3 = *piVar10 == 0;
            }
            if ((!bVar3) &&
               ((local_34 = SPxBasisBase<double>::Desc::colStatus
                                      ((Desc *)CONCAT17(in_stack_fffffffffffffcf7,
                                                        CONCAT16(in_stack_fffffffffffffcf6,
                                                                 in_stack_fffffffffffffcf0)),
                                       in_stack_fffffffffffffcec), local_34 == P_ON_LOWER ||
                (local_34 == P_ON_UPPER)))) {
              pdVar13 = VectorBase<double>::operator[]
                                  ((VectorBase<double> *)
                                   CONCAT17(in_stack_fffffffffffffcf7,
                                            CONCAT16(in_stack_fffffffffffffcf6,
                                                     in_stack_fffffffffffffcf0)),
                                   in_stack_fffffffffffffcec);
              in_stack_fffffffffffffd10 = (DIdxSet *)*pdVar13;
              in_stack_fffffffffffffd18 =
                   (SPxSolverBase<double> *)epsilon((SPxSolverBase<double> *)0x242014);
              bVar3 = EQrel<double,double,double>
                                ((double)CONCAT17(in_stack_fffffffffffffcf7,
                                                  CONCAT16(in_stack_fffffffffffffcf6,
                                                           in_stack_fffffffffffffcf0)),
                                 (double)CONCAT44(in_stack_fffffffffffffcec,
                                                  in_stack_fffffffffffffce8),1.1697182028924e-317);
              if (bVar3) {
                DIdxSet::addIdx((DIdxSet *)
                                CONCAT17(in_stack_fffffffffffffcf7,
                                         CONCAT16(in_stack_fffffffffffffcf6,
                                                  in_stack_fffffffffffffcf0)),
                                in_stack_fffffffffffffcec);
              }
            }
          }
        }
        while (stat_00 = (SPxStatus)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
              ((local_11 ^ 0xff) & 1) != 0) {
          local_18 = 0;
          local_170 = IdxSet::size(&local_160);
          uVar14 = extraout_RDX_07;
          while( true ) {
            local_170 = local_170 - 1;
            bVar15 = 0;
            if (-1 < (int)local_170) {
              bVar15 = local_11 ^ 0xff;
            }
            if ((bVar15 & 1) == 0) break;
            in_stack_fffffffffffffcf8 = (SPxSolverBase<double> *)&in_RDI->super_SPxBasisBase<double>
            ;
            IdxSet::index(&local_160,(char *)(ulong)local_170,(int)uVar14);
            in_stack_fffffffffffffd00 =
                 (SPxSolverBase<double> *)
                 SPxBasisBase<double>::baseId
                           ((SPxBasisBase<double> *)
                            CONCAT17(in_stack_fffffffffffffcf7,
                                     CONCAT16(in_stack_fffffffffffffcf6,in_stack_fffffffffffffcf0)),
                            in_stack_fffffffffffffcec);
            SPxOut::debug<soplex::SPxSolverBase<double>,_const_char_(&)[17],_soplex::SPxId_&,_0>
                      (in_RDI,(char (*) [17])"try pivoting: {}",(SPxId *)in_stack_fffffffffffffd00);
            IdxSet::index(&local_160,(char *)(ulong)local_170,__c_03);
            in_stack_fffffffffffffcf7 =
                 leave((SPxSolverBase<double> *)
                       CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                       (int)((ulong)pSVar16 >> 0x20),SUB81((ulong)pSVar16 >> 0x18,0));
            local_41 = in_stack_fffffffffffffcf7;
            (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
              super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x88])();
            if ((local_41 & 1) != 0) {
              SPxOut::debug<soplex::SPxSolverBase<double>,_const_char_(&)[13],_0>
                        (in_RDI,(char (*) [13])" -> success!");
              local_18 = local_18 + 1;
              IdxSet::remove(&local_160,(char *)(ulong)local_170);
              if ((-1 < in_RDI->maxIters) &&
                 (iVar4 = iterations((SPxSolverBase<double> *)0x2421db), in_RDI->maxIters <= iVar4))
              {
                local_11 = 1;
              }
            }
            SPxOut::debug<soplex::SPxSolverBase<double>,_const_char_(&)[2],_0>
                      (in_RDI,(char (*) [2])0x7e7535);
            in_stack_fffffffffffffcf6 =
                 isTimeLimitReached(in_stack_fffffffffffffd18,
                                    SUB81((ulong)in_stack_fffffffffffffd10 >> 0x38,0));
            uVar14 = extraout_RDX_08;
            if ((bool)in_stack_fffffffffffffcf6) {
              local_11 = 1;
            }
          }
          if (local_18 == 0) {
            local_11 = 1;
          }
          in_RDI->polishCount = local_18 + in_RDI->polishCount;
        }
        DIdxSet::~DIdxSet((DIdxSet *)
                          CONCAT17(in_stack_fffffffffffffcf7,
                                   CONCAT16(in_stack_fffffffffffffcf6,in_stack_fffffffffffffcf0)));
      }
    }
    if ((in_RDI->spxout != (SPxOut *)0x0) &&
       (VVar6 = SPxOut::getVerbosity(in_RDI->spxout), 2 < (int)VVar6)) {
      local_174 = SPxOut::getVerbosity(in_RDI->spxout);
      local_178 = 3;
      (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_178);
      soplex::operator<<((SPxOut *)
                         CONCAT17(in_stack_fffffffffffffcf7,
                                  CONCAT16(in_stack_fffffffffffffcf6,in_stack_fffffffffffffcf0)),
                         (char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      soplex::operator<<((SPxOut *)
                         CONCAT17(in_stack_fffffffffffffcf7,
                                  CONCAT16(in_stack_fffffffffffffcf6,in_stack_fffffffffffffcf0)),
                         in_stack_fffffffffffffcec);
      soplex::operator<<((SPxOut *)
                         CONCAT17(in_stack_fffffffffffffcf7,
                                  CONCAT16(in_stack_fffffffffffffcf6,in_stack_fffffffffffffcf0)),
                         (char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      soplex::operator<<((SPxOut *)
                         CONCAT17(in_stack_fffffffffffffcf7,
                                  CONCAT16(in_stack_fffffffffffffcf6,in_stack_fffffffffffffcf0)),
                         (_func_ostream_ptr_ostream_ptr *)
                         CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_174);
    }
    SPxBasisBase<double>::setStatus((SPxBasisBase<double> *)in_stack_fffffffffffffd00,stat_00);
    (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x5e])();
    bVar3 = EQrel<double,double,double>
                      ((double)CONCAT17(in_stack_fffffffffffffcf7,
                                        CONCAT16(in_stack_fffffffffffffcf6,in_stack_fffffffffffffcf0
                                                )),
                       (double)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                       1.17016483823624e-317);
    if (bVar3) {
      bVar3 = false;
    }
    else {
      bVar3 = true;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool SPxSolverBase<R>::performSolutionPolishing()
{
   // catch rare case that the iteration limit is exactly reached at optimality
   bool stop = (maxIters >= 0 && iterations() >= maxIters && !isTimeLimitReached());

   // only polish an already optimal basis
   if(stop || polishObj == POLISH_OFF || status() != OPTIMAL)
      return false;

   int nSuccessfulPivots;
   const typename SPxBasisBase<R>::Desc& ds = this->desc();
   const typename SPxBasisBase<R>::Desc::Status* rowstatus = ds.rowStatus();
   const typename SPxBasisBase<R>::Desc::Status* colstatus = ds.colStatus();
   typename SPxBasisBase<R>::Desc::Status stat;
   SPxId polishId;
   bool success = false;

   R alloweddeviation;
   R origval = value();

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- perform solution polishing" << std::endl;)

   if(rep() == COLUMN)
   {
      setType(ENTER); // use primal simplex to preserve feasibility
      init();
      alloweddeviation = entertol();

      instableEnter = false;
      theratiotester->setType(type());

      int nrows = this->nRows();
      int ncols = this->nCols();

      assert(nrows >= 0);
      assert(ncols >= 0);

      if(polishObj == POLISH_INTEGRALITY)
      {
         DIdxSet slackcandidates(nrows);
         DIdxSet continuousvars(ncols);

         // collect nonbasic slack variables that could be made basic
         for(int i = 0; i < nrows; ++i)
         {
            // only check nonbasic rows, skip equations
            if(rowstatus[i] ==  SPxBasisBase<R>::Desc::P_ON_LOWER
                  || rowstatus[i] == SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               // only consider rows with zero dual multiplier to preserve optimality
               if(EQrel((*theCoPvec)[i], (R) 0, this->epsilon()))
                  slackcandidates.addIdx(i);
            }
         }

         // collect continuous variables that could be made basic
         if(integerVariables.size() == ncols)
         {
            for(int i = 0; i < ncols; ++i)
            {
               // skip fixed variables
               if(colstatus[i] == SPxBasisBase<R>::Desc::P_ON_LOWER
                     || colstatus[i] ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
               {
                  // only consider continuous variables with zero dual multiplier to preserve optimality
                  if(EQrel(this->maxObj(i) - (*thePvec)[i], (R) 0, this->epsilon()) && integerVariables[i] == 0)
                     continuousvars.addIdx(i);
               }
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            // identify nonbasic slack variables, i.e. rows, that may be moved into the basis
            for(int i = slackcandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               polishId = coId(slackcandidates.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, rowstatus[slackcandidates.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  slackcandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // identify nonbasic variables that may be moved into the basis
            for(int i = continuousvars.size() - 1; i >= 0 && !stop; --i)
            {
               polishId = id(continuousvars.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, colstatus[continuousvars.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  continuousvars.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
      else
      {
         assert(polishObj == POLISH_FRACTIONALITY);
         assert(dim() >= 0);
         DIdxSet candidates(dim());

         // identify nonbasic variables, i.e. columns, that may be moved into the basis
         for(int i = 0; i < this->nCols() && !stop; ++i)
         {
            if(colstatus[i] == SPxBasisBase<R>::Desc::P_ON_LOWER
                  || colstatus[i] == SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               // only consider variables with zero reduced costs to preserve optimality
               if(EQrel(this->maxObj(i) - (*thePvec)[i], (R) 0, this->epsilon()))
                  candidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = candidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               polishId = id(candidates.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, colstatus[candidates.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  candidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
   }
   else
   {
      setType(LEAVE); // use primal simplex to preserve feasibility
      init();
      alloweddeviation = leavetol();
      instableLeave = false;
      theratiotester->setType(type());
      bool useIntegrality = false;
      int ncols = this->nCols();

      if(integerVariables.size() == ncols)
         useIntegrality = true;

      // in ROW rep: pivot slack out of the basis
      if(polishObj == POLISH_INTEGRALITY)
      {
         assert(dim() >= 0);
         DIdxSet basiccandidates(dim());

         // collect basic candidates that may be moved out of the basis
         for(int i = 0; i < dim(); ++i)
         {
            polishId = this->baseId(i);

            if(polishId.isSPxRowId())
               stat = ds.rowStatus(this->number(polishId));
            else
            {
               // skip (integer) variables
               if(!useIntegrality || integerVariables[this->number(SPxColId(polishId))] == 1)
                  continue;

               stat = ds.colStatus(this->number(polishId));
            }

            if(stat == SPxBasisBase<R>::Desc::P_ON_LOWER || stat ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               if(EQrel((*theFvec)[i], (R) 0, this->epsilon()))
                  basiccandidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = basiccandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               SPxOut::debug(this, "try pivoting: {}", this->baseId(basiccandidates.index(i)));
               success = leave(basiccandidates.index(i), true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  basiccandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
      else
      {
         assert(polishObj == POLISH_FRACTIONALITY);
         assert(dim() >= 0);
         DIdxSet basiccandidates(dim());

         // collect basic (integer) variables, that may be moved out of the basis
         for(int i = 0; i < dim(); ++i)
         {
            polishId = this->baseId(i);

            if(polishId.isSPxRowId())
               continue;
            else
            {
               if(useIntegrality && integerVariables[this->number(SPxColId(polishId))] == 0)
                  continue;

               stat = ds.colStatus(i);
            }

            if(stat == SPxBasisBase<R>::Desc::P_ON_LOWER || stat ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               if(EQrel((*theFvec)[i], (R) 0, this->epsilon()))
                  basiccandidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = basiccandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               SPxOut::debug(this, "try pivoting: {}", this->baseId(basiccandidates.index(i)));
               success = leave(basiccandidates.index(i), true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  basiccandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
   }

   SPX_MSG_INFO1((*this->spxout),
                 (*this->spxout) << " --- finished solution polishing (" << polishCount << " pivots)" << std::endl;)

   this->setStatus(SPxBasisBase<R>::OPTIMAL);

   // if the value() changed significantly (due to numerics) reoptimize after polishing
   if(!EQrel(value(), origval, alloweddeviation))
      return true;
   else
      return false;
}